

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.cpp
# Opt level: O1

ScoreMap *
InferExamAnswers::Algorithm::computeScoreMap
          (ScoreMap *__return_storage_ptr__,ExamResults *examResults,uint8_t n,uint8_t m)

{
  long *plVar1;
  uint8_t uVar2;
  byte bVar3;
  byte bVar4;
  unsigned_long *puVar5;
  uchar *puVar6;
  bool bVar7;
  ExamResults *pEVar8;
  mapped_type *pmVar9;
  uchar *__s;
  byte bVar10;
  bool bVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  size_type __bkt_count_hint;
  ulong __n;
  pair<std::__detail::_Node_iterator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_false,_true>,_bool>
  pVar15;
  __hashtable *__h;
  valarray<unsigned_char> score;
  allocator_type local_9a;
  key_equal local_99;
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_98;
  ulong local_90;
  uint local_84;
  ExamResults *local_80;
  key_type local_78;
  undefined **local_68;
  ulong local_60;
  undefined8 local_58;
  size_type local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  uVar2 = examResults->questionCount;
  __bkt_count_hint = 1L << (m - n & 0x3f);
  std::
  _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,__bkt_count_hint,(ScoreValarrayHash *)&local_78,
               &local_99,&local_9a);
  if ((uint8_t)(m - n) == '\0') {
    uVar14 = (ulong)examResults->studentCount;
    local_78._M_size = uVar14;
    local_78._M_data = (uchar *)operator_new(uVar14);
    memset(local_78._M_data,0,uVar14);
    pmVar9 = std::__detail::
             _Map_base<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,&local_78);
    pmVar9->solution = 0;
    pmVar9->size = 1;
    operator_delete(local_78._M_data);
  }
  else {
    local_48 = __bkt_count_hint + 0xffffffff;
    local_38 = (ulong)n;
    uVar14 = 0;
    local_84 = (uint)(byte)(uVar2 - (m - n));
    local_98 = &__return_storage_ptr__->_M_h;
    local_80 = examResults;
    local_50 = __bkt_count_hint;
    do {
      pEVar8 = local_80;
      __n = (ulong)local_80->studentCount;
      local_90 = uVar14;
      __s = (uchar *)operator_new(__n);
      local_40 = __n;
      memset(__s,0,__n);
      bVar3 = pEVar8->studentCount;
      if (bVar3 == 0) {
LAB_00113b37:
        local_78._M_size = local_40;
        local_68 = &PTR__SolutionCollection_0011dd30;
        local_58 = 1;
        local_78._M_data = __s;
        local_60 = uVar14;
        pVar15 = std::
                 _Hashtable<std::valarray<unsigned_char>,std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>,std::allocator<std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>>,std::__detail::_Select1st,InferExamAnswers::ScoreValarrayEqual,InferExamAnswers::ScoreValarrayHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::
                 _M_emplace<std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>>
                           ((_Hashtable<std::valarray<unsigned_char>,std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>,std::allocator<std::pair<std::valarray<unsigned_char>const,InferExamAnswers::SolutionCollection>>,std::__detail::_Select1st,InferExamAnswers::ScoreValarrayEqual,InferExamAnswers::ScoreValarrayHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)local_98);
        operator_delete(local_78._M_data);
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          plVar1 = (long *)((long)pVar15.first.
                                  super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
                                  ._M_cur.
                                  super__Node_iterator_base<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_true>
                           + 0x28);
          *plVar1 = *plVar1 + 1;
        }
        __s = (uchar *)0x0;
      }
      else {
        puVar5 = (local_80->answers)._M_data;
        puVar6 = (local_80->scores)._M_data;
        bVar11 = true;
        lVar12 = 0;
        do {
          uVar13 = ~((uint)(puVar5[lVar12] >> ((byte)local_38 & 0x3f)) ^ (uint)uVar14) &
                   (uint)local_48;
          uVar13 = uVar13 - (uVar13 >> 1 & 0x55555555);
          uVar13 = (uVar13 >> 2 & 0x33333333) + (uVar13 & 0x33333333);
          uVar13 = ((uVar13 >> 4) + uVar13 & 0xf0f0f0f) * 0x1010101;
          bVar10 = (byte)(uVar13 >> 0x18);
          __s[lVar12] = bVar10;
          bVar4 = puVar6[lVar12];
          if (bVar4 < bVar10) {
            bVar11 = false;
          }
          bVar7 = false;
        } while ((((uint)bVar4 <= (uVar13 >> 0x18) + local_84) && (bVar7 = bVar11, bVar10 <= bVar4))
                && (lVar12 = lVar12 + 1, (byte)lVar12 < bVar3));
        if (bVar7) goto LAB_00113b37;
      }
      uVar14 = local_90;
      operator_delete(__s);
      __return_storage_ptr__ = (ScoreMap *)local_98;
      uVar14 = (ulong)((int)uVar14 + 1);
    } while (uVar14 < local_50);
    std::
    _Hashtable<std::valarray<unsigned_char>,_std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>,_std::allocator<std::pair<const_std::valarray<unsigned_char>,_InferExamAnswers::SolutionCollection>_>,_std::__detail::_Select1st,_InferExamAnswers::ScoreValarrayEqual,_InferExamAnswers::ScoreValarrayHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::rehash(local_98,local_98->_M_element_count);
  }
  return (ScoreMap *)&__return_storage_ptr__->_M_h;
}

Assistant:

Algorithm::ScoreMap Algorithm::computeScoreMap(const ExamResults& examResults, const uint8_t n, const uint8_t m)
{
	/**
	 *  Compute the length of the answers to create for the current partition
	 *  and the also compute the length of the anwers for the other partition.
	 */
	const uint8_t currentSequenceLength = m - n;
	const uint8_t otherSequenceLength = examResults.questionCount - currentSequenceLength;

	/**
	 * We have to check 2^currentSequenceLength solutions.
	 * So we create that number so we can use it as the upper
	 * limit in a for loop.
	 */
	const uint64_t solutionsToCheck = 1UL << currentSequenceLength;

	/**
	 * Since we are checking a subset of the total answers
	 * of a student we might have some extra bits from other
	 * answers we need to disregard. This mask uses can be used
	 * to filter out only the bits of the current subset since
	 * it contains currentSequenceLength number of 1 bits
	 */
	const uint64_t scoreMask = solutionsToCheck - 1UL;

	/**
	 * Initial bucket count will be the amount of possible solutions so a rehash
	 * will never occur while trying solutions.
	 */
	ScoreMap scoreMap(solutionsToCheck);

	/**
	 * If the length of the current partition is 0 no solution would be checked.
	 * However there still is a correct in that case. One with 0 solutions
	 */
	if (currentSequenceLength == 0) {
		std::valarray<uint8_t> score(examResults.studentCount);

		auto collection = SolutionCollection();
		collection.addSolution(0);
		scoreMap[std::move(score)] = std::move(collection);
		return scoreMap;
	}

	/**
	 * We create every possible solution from 0 to 2^n
	 * Verify if the resulting score with that solution
	 * still makes it possible to obtain the actual score
	 * the student got.
	 */
	for (uint32_t i = 0; i < solutionsToCheck; ++i) {
		auto keepSolution = true;
		std::valarray<uint8_t> score(examResults.studentCount);

		for (uint8_t j = 0; j < examResults.studentCount; ++j) {
			/**
			 * To obtain the score a student has obtained given a solution and the answer
			 * We first have to bitshift the solution over the current answers we are going
			 * to check. Then we apply a XOR operation. This results in a bit string that
			 * will contain a 1 if the answer didn't match and a 0 if it did match. So we
			 * negate that result. However since this result can still contain answers
			 * from the partition that we are currently disregarding we have to mask them
			 * out using the scoreMask.
			 *
			 * Now finally we need to count the amount of set bits in the resulting bit string.
			 * For this we use the special builtin function popcount which actually results
			 * in a single assembly instruction on modern hardware.
			 */
			const uint64_t correctAnswers = ~((examResults.answers[j] >> n) ^ i) & scoreMask;
			score[j] = __builtin_popcount(correctAnswers);

			/**
			 * The solution will be thrown away if the current
			 * score plus the perfect score for the other partition
			 * is smaller then the required score because there is no way
			 * to obtain the required score then.
			 * The same applies if the score exceeds the required score.
			 */
			if (score[j] + otherSequenceLength < examResults.scores[j] || score[j] > examResults.scores[j]) {
				keepSolution = false;
				break;
			}
		}

		if (!keepSolution) {
			continue;
		}

		SolutionCollection collection;
		collection.addSolution(i);

		// Clang-tidy sees this as a dead store but it's a false positive
		auto [it, inserted] = scoreMap.insert({std::move(score), std::move(collection)}); // NOLINT
		if (!inserted) {
			it->second.grow(1);
		}
	}

	/**
	 * Rehashing will remove unused buckets. Since after this the map will not
	 * be mutated further this will improve iteration speed when combining the
	 * partitions
	 */
	scoreMap.rehash(scoreMap.size());

	return scoreMap;
}